

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLongNames.cpp
# Opt level: O0

void __thiscall TestLongFunction::Run(TestLongFunction *this)

{
  bool bVar1;
  int local_2820;
  uint local_281c;
  int t;
  uint i;
  char name [2048];
  char code [8192];
  TestLongFunction *this_local;
  
  for (local_281c = 0; local_281c < 0x800; local_281c = local_281c + 1) {
    *(undefined1 *)((long)&t + (ulong)local_281c) = 0x61;
  }
  name[0x7f7] = '\0';
  NULLC::SafeSprintf(name + 0x7f8,0x2000,
                     "void foo(int bar){ int %s(){ return bar; } int %s(int u){ return bar + u; } } return 1;"
                     ,&t);
  for (local_2820 = 0; local_2820 < 3; local_2820 = local_2820 + 1) {
    if ((*(byte *)((long)&Tests::testExecutor + (long)local_2820) & 1) != 0) {
      testsCount[local_2820] = testsCount[local_2820] + 1;
      bVar1 = Tests::RunCode(name + 0x7f8,testTarget[local_2820],"1","Long function name.",false);
      if (bVar1) {
        testsPassed[local_2820] = testsPassed[local_2820] + 1;
      }
    }
  }
  return;
}

Assistant:

virtual void Run()
	{
		char code[8192];
		char name[NULLC_MAX_VARIABLE_NAME_LENGTH];
		for(unsigned int i = 0; i < NULLC_MAX_VARIABLE_NAME_LENGTH; i++)
			name[i] = 'a';
		name[NULLC_MAX_VARIABLE_NAME_LENGTH - 1] = 0;
		NULLC::SafeSprintf(code, 8192, "void foo(int bar){ int %s(){ return bar; } int %s(int u){ return bar + u; } } return 1;", name, name);
		for(int t = 0; t < TEST_TARGET_COUNT; t++)
		{
			if(!Tests::testExecutor[t])
				continue;

			testsCount[t]++;
			if(Tests::RunCode(code, testTarget[t], "1", "Long function name."))
				testsPassed[t]++;
		}
	}